

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

int functionBlock(object *proc,int varSize,int retSize)

{
  object *poVar1;
  typeDesc *ptVar2;
  char *msg;
  
  if (currentSymbol == 0x131) {
    getSymbol();
    if (currentSymbol == 0x132) {
      msg = "empty function";
    }
    else {
      while (currentSymbol == 0x267) {
        getSymbol();
        poVar1 = variableDeclaration(0x2c1);
        ptVar2 = getType(poVar1->typeIndex);
        varSize = varSize + ptVar2->size;
        poVar1->val = -varSize;
        poVar1->lev = currentLevel;
      }
      proc->val = pc;
      enter(varSize);
      statementSequence(proc,retSize);
      if (currentSymbol == 0x132) {
        getSymbol();
        return varSize;
      }
      msg = "missing closing curly bracket in function declaration";
    }
  }
  else {
    msg = "missing left curly bracket in function block";
  }
  mark(msg);
  exit(-1);
}

Assistant:

procedure
int functionBlock(struct object *proc, int varSize, int retSize) {
	variable int ret;
	variable struct object *obj;
	variable struct typeDesc *type;
	obj = NULL; type = NULL; ret = 0;
	if (currentSymbol == SYMBOL_CLBRAK) {
		getSymbol();
		if (currentSymbol == SYMBOL_CRBRAK) {
			mark("empty function");
			exit(-1);
		}
	} else {
		mark("missing left curly bracket in function block");
		exit(-1);
	}
	while (currentSymbol == SYMBOL_VAR) {
			getSymbol();
			obj = variableDeclaration(CLASS_VAR);
			type = getType(obj->typeIndex);
			varSize = varSize + type->size;
			obj->val = -varSize;
			obj->lev = currentLevel;
	}
	proc->val = pc; 
	enter(varSize);
	statementSequence(proc, retSize);
	if (currentSymbol == SYMBOL_CRBRAK) {
		getSymbol();
	} else {
		mark("missing closing curly bracket in function declaration");
		exit(-1);
	}
	return varSize;
}